

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O3

int run_test_pipe_ref2(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  uv_pipe_t h;
  undefined1 auStack_5d0 [120];
  code *pcStack_558;
  undefined1 *puStack_550;
  char *pcStack_548;
  undefined8 uStack_540;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined1 *puStack_520;
  undefined1 *puStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 uStack_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined1 auStack_4e8 [136];
  undefined1 auStack_460 [264];
  undefined1 *puStack_358;
  undefined1 auStack_340 [264];
  code *pcStack_238;
  undefined1 auStack_228 [264];
  code *pcStack_120;
  undefined1 local_110 [264];
  
  pcStack_120 = (code *)0x169b97;
  uVar2 = uv_default_loop();
  pcStack_120 = (code *)0x169ba9;
  uv_pipe_init(uVar2,local_110,0);
  pcStack_120 = (code *)0x169bbd;
  uv_listen(local_110,0x80,fail_cb);
  pcStack_120 = (code *)0x169bc5;
  uv_unref(local_110);
  pcStack_120 = (code *)0x169bca;
  uVar2 = uv_default_loop();
  pcStack_120 = (code *)0x169bd4;
  uv_run(uVar2,0);
  pcStack_120 = (code *)0x169bdc;
  do_close(local_110);
  pcStack_120 = (code *)0x169be1;
  uVar2 = uv_default_loop();
  pcStack_120 = (code *)0x169bf5;
  uv_walk(uVar2,close_walk_cb,0);
  pcStack_120 = (code *)0x169bff;
  uv_run(uVar2,0);
  pcStack_120 = (code *)0x169c04;
  uVar3 = uv_default_loop();
  pcStack_120 = (code *)0x169c0c;
  iVar1 = uv_loop_close(uVar3);
  if (iVar1 == 0) {
    return 0;
  }
  pcStack_120 = run_test_pipe_ref3;
  run_test_pipe_ref2_cold_1();
  pcStack_238 = (code *)0x169c2d;
  pcStack_120 = (code *)uVar2;
  uVar2 = uv_default_loop();
  puVar4 = auStack_228;
  pcStack_238 = (code *)0x169c3f;
  uv_pipe_init(uVar2,puVar4,0);
  pcStack_238 = (code *)0x169c5c;
  uv_pipe_connect(&connect_req,puVar4,"/tmp/uv-test-sock",connect_and_shutdown);
  pcStack_238 = (code *)0x169c64;
  uv_unref(puVar4);
  pcStack_238 = (code *)0x169c69;
  uVar2 = uv_default_loop();
  pcStack_238 = (code *)0x169c73;
  uv_run(uVar2,0);
  if (connect_cb_called == 1) {
    if (shutdown_cb_called != 1) goto LAB_00169cd3;
    pcStack_238 = (code *)0x169c8f;
    do_close(auStack_228);
    pcStack_238 = (code *)0x169c94;
    puVar4 = (undefined1 *)uv_default_loop();
    pcStack_238 = (code *)0x169ca8;
    uv_walk(puVar4,close_walk_cb,0);
    pcStack_238 = (code *)0x169cb2;
    uv_run(puVar4,0);
    pcStack_238 = (code *)0x169cb7;
    uVar2 = uv_default_loop();
    pcStack_238 = (code *)0x169cbf;
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_238 = (code *)0x169cd3;
    run_test_pipe_ref3_cold_1();
LAB_00169cd3:
    pcStack_238 = (code *)0x169cd8;
    run_test_pipe_ref3_cold_2();
  }
  pcStack_238 = run_test_pipe_ref4;
  run_test_pipe_ref3_cold_3();
  pcStack_238 = (code *)puVar4;
  uVar2 = uv_default_loop();
  puVar4 = auStack_340;
  uv_pipe_init(uVar2,puVar4,0);
  uv_pipe_connect(&connect_req,puVar4,"/tmp/uv-test-sock",connect_and_write);
  uv_unref(puVar4);
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  if (connect_cb_called == 1) {
    if (write_cb_called != 1) goto LAB_00169d99;
    if (shutdown_cb_called != 1) goto LAB_00169d9e;
    do_close(auStack_340);
    puVar4 = (undefined1 *)uv_default_loop();
    uv_walk(puVar4,close_walk_cb,0);
    uv_run(puVar4,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_pipe_ref4_cold_1();
LAB_00169d99:
    run_test_pipe_ref4_cold_2();
LAB_00169d9e:
    run_test_pipe_ref4_cold_3();
  }
  run_test_pipe_ref4_cold_4();
  uStack_540 = 0;
  puStack_550 = (undefined1 *)0x0;
  pcStack_548 = "spawn_helper4";
  uStack_510 = 0;
  uStack_508 = 0;
  uStack_500 = 0;
  uStack_4f8 = 0;
  uStack_4f0 = 0;
  uStack_530 = 0x100;
  puVar5 = auStack_460;
  pcStack_558 = (code *)0x169dfb;
  puStack_358 = puVar4;
  iVar1 = uv_exepath(puVar5);
  if (iVar1 == 0) {
    uStack_528 = 0;
    pcStack_558 = (code *)0x169e22;
    puStack_550 = puVar5;
    puStack_520 = puVar5;
    puStack_518 = (undefined1 *)&puStack_550;
    uVar2 = uv_default_loop();
    pcStack_558 = (code *)0x169e32;
    iVar1 = uv_spawn(uVar2,auStack_4e8,&uStack_528);
    if (iVar1 != 0) goto LAB_00169eb3;
    puVar5 = auStack_4e8;
    pcStack_558 = (code *)0x169e43;
    uv_unref(puVar5);
    pcStack_558 = (code *)0x169e48;
    uVar2 = uv_default_loop();
    pcStack_558 = (code *)0x169e52;
    uv_run(uVar2,0);
    pcStack_558 = (code *)0x169e5f;
    iVar1 = uv_process_kill(puVar5,0xf);
    if (iVar1 != 0) goto LAB_00169eb8;
    pcStack_558 = (code *)0x169e6d;
    do_close(auStack_4e8);
    pcStack_558 = (code *)0x169e72;
    puVar5 = (undefined1 *)uv_default_loop();
    pcStack_558 = (code *)0x169e86;
    uv_walk(puVar5,close_walk_cb,0);
    pcStack_558 = (code *)0x169e90;
    uv_run(puVar5,0);
    pcStack_558 = (code *)0x169e95;
    uVar2 = uv_default_loop();
    pcStack_558 = (code *)0x169e9d;
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_558 = (code *)0x169eb3;
    run_test_process_ref_cold_1();
LAB_00169eb3:
    pcStack_558 = (code *)0x169eb8;
    run_test_process_ref_cold_2();
LAB_00169eb8:
    pcStack_558 = (code *)0x169ebd;
    run_test_process_ref_cold_3();
  }
  pcStack_558 = run_test_has_ref;
  run_test_process_ref_cold_4();
  pcStack_558 = (code *)puVar5;
  uVar2 = uv_default_loop();
  puVar4 = auStack_5d0;
  uv_idle_init(uVar2,puVar4);
  uv_ref(puVar4);
  iVar1 = uv_has_ref(puVar4);
  if (iVar1 == 1) {
    puVar4 = auStack_5d0;
    uv_unref(puVar4);
    iVar1 = uv_has_ref(puVar4);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      puVar4 = (undefined1 *)uv_default_loop();
      iVar1 = uv_loop_close(puVar4);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00169f56;
    }
  }
  else {
    run_test_has_ref_cold_1();
  }
  run_test_has_ref_cold_2();
LAB_00169f56:
  run_test_has_ref_cold_3();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(puVar4,0);
  return iVar1;
}

Assistant:

TEST_IMPL(pipe_ref2) {
  uv_pipe_t h;
  uv_pipe_init(uv_default_loop(), &h, 0);
  uv_listen((uv_stream_t*)&h, 128, (uv_connection_cb)fail_cb);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY();
  return 0;
}